

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

int TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(TPZShapeData *data)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (uint)(data->fHDivNumConnectShape).super_TPZVec<int>.fNElements;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    return iVar1;
  }
  return 0;
}

Assistant:

inline int64_t size() const { return fNElements; }